

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O2

bool Imf_3_4::anon_unknown_0::checkError(istream *is,streamsize expected)

{
  uint uVar1;
  int *piVar2;
  ostream *poVar3;
  InputExc *this;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  uVar1 = *(uint *)(is + *(long *)(*(long *)is + -0x18) + 0x20);
  if ((uVar1 & 5) != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      Iex_3_4::throwErrnoExc();
    }
    if (*(long *)(is + 8) < expected) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar3 = std::operator<<(local_190,"Early end of file: read ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      poVar3 = std::operator<<(poVar3," out of ");
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::operator<<(poVar3," requested bytes.");
      this = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::InputExc::InputExc(this,(stringstream *)&_iex_throw_s);
      __cxa_throw(this,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
    }
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool
checkError (istream& is, streamsize expected = 0)
{
    if (!is)
    {
        if (errno) IEX_NAMESPACE::throwErrnoExc ();

        if (is.gcount () < expected)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: read " << is.gcount () << " out of "
                                           << expected << " requested bytes.");
        }
        return false;
    }

    return true;
}